

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  uint *puVar1;
  U32 *pUVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 UVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  UVar6 = size + 0xf;
  if (-1 < (int)size) {
    UVar6 = size;
  }
  if ((size & 0xf) == 0) {
    if (-1 < (int)size) {
      if (0xf < size) {
        uVar7 = reducerValue + 2;
        iVar9 = 0;
        iVar8 = 0;
        do {
          lVar10 = 0;
          do {
            puVar1 = table + iVar8 + lVar10;
            uVar3 = puVar1[1];
            uVar4 = puVar1[2];
            uVar5 = puVar1[3];
            pUVar2 = table + iVar8 + lVar10;
            *pUVar2 = ~-(uint)((int)(*puVar1 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) &
                      *puVar1 - reducerValue;
            pUVar2[1] = ~-(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) &
                        uVar3 - reducerValue;
            pUVar2[2] = ~-(uint)((int)(uVar4 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) &
                        uVar4 - reducerValue;
            pUVar2[3] = ~-(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) &
                        uVar5 - reducerValue;
            lVar10 = lVar10 + 4;
          } while (lVar10 != 0x10);
          iVar9 = iVar9 + 1;
          iVar8 = iVar8 + 0x10;
        } while (iVar9 != (int)UVar6 >> 4);
      }
      return;
    }
    __assert_fail("size < (1U<<31)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa04,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xa03,"void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
               );
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}